

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expression __thiscall
cnn::expr::detail::
f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
          (detail *this,vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *xs)

{
  ComputationGraph *arguments;
  pointer pEVar1;
  pointer pEVar2;
  undefined8 extraout_RDX;
  Expression EVar3;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> xis;
  allocator_type local_3d;
  undefined4 local_3c;
  _Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> local_38;
  
  pEVar2 = (xs->super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  arguments = pEVar2->pg;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)&local_38,
             (long)(xs->
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 4,&local_3d);
  pEVar1 = (xs->super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (xs->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    (local_38._M_impl.super__Vector_impl_data._M_start)->t = (pEVar2->i).t;
    local_38._M_impl.super__Vector_impl_data._M_start =
         local_38._M_impl.super__Vector_impl_data._M_start + 1;
  }
  ComputationGraph::
  add_function<cnn::Concatenate,std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>
            ((ComputationGraph *)&local_3c,
             (vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)arguments);
  *(ComputationGraph **)this = arguments;
  *(undefined4 *)(this + 8) = local_3c;
  std::_Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::~_Vector_base
            (&local_38);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }